

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.h
# Opt level: O0

void __thiscall CMU462::Matrix4x4::Matrix4x4(Matrix4x4 *this,double *data)

{
  double dVar1;
  double *pdVar2;
  Vector4D *local_28;
  int local_20;
  int local_1c;
  int j;
  int i;
  double *data_local;
  Matrix4x4 *this_local;
  
  local_28 = this->entries;
  do {
    Vector4D::Vector4D(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != this[1].entries);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      dVar1 = data[local_1c * 4 + local_20];
      pdVar2 = operator()(this,local_1c,local_20);
      *pdVar2 = dVar1;
    }
  }
  return;
}

Assistant:

Matrix4x4(double * data)
  {
    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
      // Transpostion happens within the () query.
      (*this)(i,j) = data[i*4 + j];
    }

  }